

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::date_t,duckdb::date_t,long,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  byte bVar1;
  bool bVar2;
  date_t *pdVar3;
  date_t *pdVar4;
  long *plVar5;
  long lVar6;
  byte in_CL;
  Vector *in_RDX;
  Vector *in_RSI;
  bool in_stack_0000000f;
  long *result_data;
  date_t *rdata;
  date_t *ldata;
  undefined7 in_stack_ffffffffffffffb8;
  int32_t iVar7;
  int32_t iVar8;
  
  bVar1 = in_CL & 1;
  Vector::SetVectorType(in_RSI,(VectorType)((ulong)in_RDX >> 0x38));
  pdVar3 = ConstantVector::GetData<duckdb::date_t>((Vector *)0x12e6af4);
  pdVar4 = ConstantVector::GetData<duckdb::date_t>((Vector *)0x12e6b03);
  plVar5 = ConstantVector::GetData<long>((Vector *)0x12e6b12);
  bVar2 = ConstantVector::IsNull((Vector *)0x12e6b21);
  if ((!bVar2) && (bVar2 = ConstantVector::IsNull((Vector *)0x12e6b2f), !bVar2)) {
    iVar8 = pdVar3->days;
    iVar7 = pdVar4->days;
    ConstantVector::Validity(in_RDX);
    lVar6 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::SubtractOperator,duckdb::date_t,duckdb::date_t,long>
                      (SUB81((ulong)plVar5 >> 0x38,0),(date_t)(int32_t)((ulong)pdVar4 >> 0x20),
                       (date_t)(int32_t)pdVar4,(ValidityMask *)CONCAT44(iVar8,iVar7),
                       CONCAT17(bVar1,in_stack_ffffffffffffffb8));
    *plVar5 = lVar6;
    return;
  }
  ConstantVector::SetNull((Vector *)result_data,in_stack_0000000f);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}